

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

int Cec_ManPatComputePattern_rec(Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  iVar2 = 0;
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar3 = (uint)*(undefined8 *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) {
      uVar3 = Cec_ObjSatVarValue(pSat,pObj);
      uVar4 = *(ulong *)pObj;
      iVar2 = 1;
    }
    else {
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x97,
                      "int Cec_ManPatComputePattern_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = Cec_ManPatComputePattern_rec(pSat,p,pObj + -(ulong)(uVar3 & 0x1fffffff));
      iVar2 = Cec_ManPatComputePattern_rec
                        (pSat,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar2 = iVar2 + iVar1;
      uVar4 = *(ulong *)pObj;
      uVar3 = ((uint)(uVar4 >> 0x3d) ^
              (uint)((ulong)*(undefined8 *)(pObj + -(uVar4 >> 0x20 & 0x1fffffff)) >> 0x3e)) &
              ((uint)((ulong)*(undefined8 *)(pObj + -(uVar4 & 0x1fffffff)) >> 0x3e) ^
              (uint)(uVar4 >> 0x1d) & 7);
    }
    *(ulong *)pObj = uVar4 & 0xbfffffffffffffff | (ulong)(uVar3 & 1) << 0x3e;
  }
  return iVar2;
}

Assistant:

int Cec_ManPatComputePattern_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Counter = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark1 = Cec_ObjSatVarValue( pSat, pObj );
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin0(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin1(pObj) );
    pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                   (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
    return Counter;
}